

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O2

void __thiscall IndividualBeliefJESP::~IndividualBeliefJESP(IndividualBeliefJESP *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&this->super_Belief = pvVar1;
  *(void **)(&(this->super_Belief).field_0x0 + *(long *)((long)pvVar1 + -0xb8)) = vtt[3];
  if (this->_m_stepsizeJOHOH != (size_t *)0x0) {
    operator_delete__(this->_m_stepsizeJOHOH);
  }
  if (this->_m_stepsizeSJOH != (size_t *)0x0) {
    operator_delete__(this->_m_stepsizeSJOH);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_sizeVec).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_nrOH_others).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&this->_m_others);
  ::Belief::~Belief(&this->super_Belief,vtt + 1);
  return;
}

Assistant:

IndividualBeliefJESP::~IndividualBeliefJESP()
{
    delete [] _m_stepsizeJOHOH;
    delete [] _m_stepsizeSJOH;
}